

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O0

void nng_http_handler_set_method(nng_http_handler *h,char *meth)

{
  char *meth_local;
  nng_http_handler *h_local;
  
  nni_http_handler_set_method(h,meth);
  return;
}

Assistant:

void
nng_http_handler_set_method(nng_http_handler *h, const char *meth)
{
#ifdef NNG_SUPP_HTTP
	nni_http_handler_set_method(h, meth);
#else
	NNI_ARG_UNUSED(h);
	NNI_ARG_UNUSED(meth);
#endif
}